

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

void VW::setup_example(vw *all,example *ae)

{
  unsigned_long *puVar1;
  bool bVar2;
  int iVar3;
  parser *ppVar4;
  byte *pbVar5;
  uint uVar6;
  uint32_t *puVar7;
  byte bVar8;
  long lVar9;
  example *__range2;
  size_t sVar10;
  uint uVar11;
  unsigned_long *puVar12;
  byte *pbVar13;
  float fVar14;
  float new_features_sum_feat_sq;
  size_t new_features_cnt;
  example *local_38;
  float local_2c;
  size_t local_28;
  
  ppVar4 = all->p;
  local_38 = ae;
  if ((ppVar4->sort_features == true) && (ae->sorted == false)) {
    unique_sort_features(all->parse_mask,ae);
    ppVar4 = all->p;
  }
  if (ppVar4->write_cache == true) {
    (*(ppVar4->lp).cache_label)(&ae->l,ppVar4->output);
    cache_features(all->p->output,ae,all->parse_mask);
  }
  ae->partial_prediction = 0.0;
  ae->num_features = 0;
  ae->loss = 0.0;
  ae->total_sum_feat_sq = 0.0;
  ae->example_counter = all->p->end_parsed_examples;
  ppVar4 = all->p;
  bVar8 = 1;
  if (ppVar4->emptylines_separate_examples == false) {
    ppVar4->in_pass_counter = ppVar4->in_pass_counter + 1;
    ppVar4 = all->p;
    bVar8 = ppVar4->emptylines_separate_examples;
  }
  uVar11 = 0;
  uVar6 = all->holdout_period - 1;
  if ((bVar8 & 1) == 0) {
    uVar6 = uVar11;
  }
  if (all->holdout_set_off == false) {
    if (all->holdout_after == 0) {
      uVar11 = (uint)(ppVar4->in_pass_counter % all->holdout_period == uVar6);
    }
    else {
      uVar11 = (uint)(all->holdout_after < ppVar4->in_pass_counter);
    }
  }
  ae->test_only = SUB41(uVar11,0);
  bVar2 = (*(all->p->lp).test_label)(&ae->l);
  ae->test_only = (bool)(ae->test_only | bVar2);
  ppVar4 = all->p;
  if (ppVar4->emptylines_separate_examples == true) {
    iVar3 = example_is_newline(ae);
    ppVar4 = all->p;
    if (iVar3 != 0) {
      ppVar4->in_pass_counter = ppVar4->in_pass_counter + 1;
      ppVar4 = all->p;
    }
  }
  fVar14 = (*(ppVar4->lp).get_weight)(&ae->l);
  ae->weight = fVar14;
  if (all->ignore_some == true) {
    pbVar5 = (ae->super_example_predict).indices._end;
    for (pbVar13 = (ae->super_example_predict).indices._begin; pbVar13 != pbVar5;
        pbVar13 = pbVar13 + 1) {
      if (all->ignore[*pbVar13] == true) {
        features::clear((ae->super_example_predict).feature_space + *pbVar13);
        memmove(pbVar13,pbVar13 + 1,
                (long)(ae->super_example_predict).indices._end - (long)(pbVar13 + 1));
        pbVar5 = (ae->super_example_predict).indices._end + -1;
        (ae->super_example_predict).indices._end = pbVar5;
        pbVar13 = pbVar13 + -1;
      }
    }
  }
  if ((all->ngram_strings).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (all->ngram_strings).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    generateGrams(all,&local_38);
  }
  if (all->add_constant == true) {
    add_constant_feature(all,ae);
  }
  if ((all->limit_strings).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (all->limit_strings).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    feature_limit(all,ae);
  }
  puVar7 = &(all->weights).dense_weights._stride_shift;
  if ((all->weights).sparse != false) {
    puVar7 = &(all->weights).sparse_weights._stride_shift;
  }
  lVar9 = (ulong)all->wpp << ((byte)*puVar7 & 0x3f);
  pbVar13 = (ae->super_example_predict).indices._begin;
  if (lVar9 != 1) {
    pbVar5 = (ae->super_example_predict).indices._end;
    for (; pbVar13 != pbVar5; pbVar13 = pbVar13 + 1) {
      puVar1 = (ae->super_example_predict).feature_space[*pbVar13].indicies._end;
      for (puVar12 = (ae->super_example_predict).feature_space[*pbVar13].indicies._begin;
          puVar12 != puVar1; puVar12 = puVar12 + 1) {
        *puVar12 = *puVar12 * lVar9;
      }
    }
    pbVar13 = (ae->super_example_predict).indices._begin;
  }
  ae->num_features = 0;
  ae->total_sum_feat_sq = 0.0;
  pbVar5 = (ae->super_example_predict).indices._end;
  fVar14 = 0.0;
  sVar10 = 0;
  for (; pbVar13 != pbVar5; pbVar13 = pbVar13 + 1) {
    bVar8 = *pbVar13;
    sVar10 = sVar10 + ((long)(ae->super_example_predict).feature_space[bVar8].values._end -
                       (long)(ae->super_example_predict).feature_space[bVar8].values._begin >> 2);
    ae->num_features = sVar10;
    fVar14 = fVar14 + (ae->super_example_predict).feature_space[bVar8].sum_feat_sq;
    ae->total_sum_feat_sq = fVar14;
  }
  INTERACTIONS::eval_count_of_generated_ft(all,ae,&local_28,&local_2c);
  ae->num_features = ae->num_features + local_28;
  ae->total_sum_feat_sq = local_2c + ae->total_sum_feat_sq;
  return;
}

Assistant:

void setup_example(vw& all, example* ae)
{
  if (all.p->sort_features && ae->sorted == false)
    unique_sort_features(all.parse_mask, ae);

  if (all.p->write_cache)
  {
    all.p->lp.cache_label(&ae->l, *(all.p->output));
    cache_features(*(all.p->output), ae, all.parse_mask);
  }

  ae->partial_prediction = 0.;
  ae->num_features = 0;
  ae->total_sum_feat_sq = 0;
  ae->loss = 0.;

  ae->example_counter = (size_t)(all.p->end_parsed_examples);
  if (!all.p->emptylines_separate_examples)
    all.p->in_pass_counter++;

  ae->test_only = is_test_only(all.p->in_pass_counter, all.holdout_period, all.holdout_after, all.holdout_set_off,
      all.p->emptylines_separate_examples ? (all.holdout_period - 1) : 0);
  ae->test_only |= all.p->lp.test_label(&ae->l);

  if (all.p->emptylines_separate_examples && example_is_newline(*ae))
    all.p->in_pass_counter++;

  ae->weight = all.p->lp.get_weight(&ae->l);

  if (all.ignore_some)
    for (unsigned char* i = ae->indices.begin(); i != ae->indices.end(); i++)
      if (all.ignore[*i])
      {
        // delete namespace
        ae->feature_space[*i].clear();
        memmove(i, i + 1, (ae->indices.end() - (i + 1)) * sizeof(*i));
        ae->indices.end()--;
        i--;
      }

  if (all.ngram_strings.size() > 0)
    generateGrams(all, ae);

  if (all.add_constant)  // add constant feature
    VW::add_constant_feature(all, ae);

  if (all.limit_strings.size() > 0)
    feature_limit(all, ae);

  uint64_t multiplier = (uint64_t)all.wpp << all.weights.stride_shift();

  if (multiplier != 1)  // make room for per-feature information.
    for (features& fs : *ae)
      for (auto& j : fs.indicies) j *= multiplier;
  ae->num_features = 0;
  ae->total_sum_feat_sq = 0;
  for (features& fs : *ae)
  {
    ae->num_features += fs.size();
    ae->total_sum_feat_sq += fs.sum_feat_sq;
  }

  size_t new_features_cnt;
  float new_features_sum_feat_sq;
  INTERACTIONS::eval_count_of_generated_ft(all, *ae, new_features_cnt, new_features_sum_feat_sq);
  ae->num_features += new_features_cnt;
  ae->total_sum_feat_sq += new_features_sum_feat_sq;
}